

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.hpp
# Opt level: O2

unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> __thiscall
TasGrid::GridReaderVersion5<TasGrid::GridGlobal>::read<TasGrid::IO::mode_binary_type>
          (GridReaderVersion5<TasGrid::GridGlobal> *this,AccelerationContext *acc,istream *is)

{
  GridGlobal *this_00;
  bool bVar1;
  int iVar2;
  TypeOneDRule TVar3;
  int max_level;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  long lVar5;
  MultiIndexSet *work;
  double dVar6;
  OneDimensionalWrapper local_e0;
  AccelerationContext *local_28;
  
  local_28 = acc;
  Utils::make_unique<TasGrid::GridGlobal,TasGrid::AccelerationContext_const*&>
            ((Utils *)this,&local_28);
  iVar2 = IO::readNumber<TasGrid::IO::mode_binary_type,int>(is);
  *(int *)(*(long *)this + 0x10) = iVar2;
  iVar2 = IO::readNumber<TasGrid::IO::mode_binary_type,int>(is);
  *(int *)(*(long *)this + 0x14) = iVar2;
  dVar6 = IO::readNumber<TasGrid::IO::mode_binary_type,double>(is);
  *(double *)(*(long *)this + 0x98) = dVar6;
  dVar6 = IO::readNumber<TasGrid::IO::mode_binary_type,double>(is);
  *(double *)(*(long *)this + 0xa0) = dVar6;
  TVar3 = IO::readRule<TasGrid::IO::mode_binary_type>(is);
  lVar5 = *(long *)this;
  *(TypeOneDRule *)(lVar5 + 0x90) = TVar3;
  if (TVar3 == rule_customtabulated) {
    CustomTabulated::CustomTabulated<TasGrid::IO::mode_binary_type>((CustomTabulated *)&local_e0,is)
    ;
    CustomTabulated::operator=
              ((CustomTabulated *)(*(long *)this + 0x260),(CustomTabulated *)&local_e0);
    CustomTabulated::~CustomTabulated((CustomTabulated *)&local_e0);
  }
  iVar2 = (int)lVar5;
  MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>((MultiIndexSet *)&local_e0,is);
  MultiIndexSet::operator=((MultiIndexSet *)(*(long *)this + 0x160),(MultiIndexSet *)&local_e0);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_e0.num_points.super__Vector_base<int,_std::allocator<int>_>);
  MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>((MultiIndexSet *)&local_e0,is);
  MultiIndexSet::operator=((MultiIndexSet *)(*(long *)this + 0x188),(MultiIndexSet *)&local_e0);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_e0.num_points.super__Vector_base<int,_std::allocator<int>_>);
  IO::readVector<TasGrid::IO::mode_binary_type,int,int>
            ((vector<int,_std::allocator<int>_> *)&local_e0,(IO *)is,
             (istream *)(ulong)*(uint *)(*(long *)this + 400),iVar2);
  ::std::vector<int,_std::allocator<int>_>::_M_move_assign
            ((vector<int,_std::allocator<int>_> *)(*(long *)this + 0x1b0),&local_e0);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_e0);
  bVar1 = IO::readFlag<TasGrid::IO::mode_binary_type>(is);
  if (bVar1) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>((MultiIndexSet *)&local_e0,is);
    MultiIndexSet::operator=((MultiIndexSet *)(*(long *)this + 0x18),(MultiIndexSet *)&local_e0);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_e0.num_points.super__Vector_base<int,_std::allocator<int>_>);
  }
  bVar1 = IO::readFlag<TasGrid::IO::mode_binary_type>(is);
  if (bVar1) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>((MultiIndexSet *)&local_e0,is);
    MultiIndexSet::operator=((MultiIndexSet *)(*(long *)this + 0x40),(MultiIndexSet *)&local_e0);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_e0.num_points.super__Vector_base<int,_std::allocator<int>_>);
  }
  IO::readVector<TasGrid::IO::mode_binary_type,int,int>
            ((vector<int,_std::allocator<int>_> *)&local_e0,(IO *)is,
             (istream *)(ulong)*(uint *)(*(long *)this + 0x10),iVar2);
  ::std::vector<int,_std::allocator<int>_>::_M_move_assign
            ((vector<int,_std::allocator<int>_> *)(*(long *)this + 0x1e0),&local_e0);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_e0);
  if (0 < *(int *)(*(long *)this + 0x14)) {
    StorageSet::StorageSet<TasGrid::IO::mode_binary_type>((StorageSet *)&local_e0,is);
    StorageSet::operator=((StorageSet *)(*(long *)this + 0x68),(StorageSet *)&local_e0);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_e0.num_points);
  }
  bVar1 = IO::readFlag<TasGrid::IO::mode_binary_type>(is);
  if (bVar1) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>((MultiIndexSet *)&local_e0,is);
    MultiIndexSet::operator=((MultiIndexSet *)(*(long *)this + 0x1f8),(MultiIndexSet *)&local_e0);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_e0.num_points.super__Vector_base<int,_std::allocator<int>_>);
    max_level = MultiIndexSet::getMaxIndex((MultiIndexSet *)(*(long *)this + 0x1f8));
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>((MultiIndexSet *)&local_e0,is);
    MultiIndexSet::operator=((MultiIndexSet *)(*(long *)this + 0x220),(MultiIndexSet *)&local_e0);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_e0.num_points.super__Vector_base<int,_std::allocator<int>_>);
    IO::readVector<TasGrid::IO::mode_binary_type,int,int>
              ((vector<int,_std::allocator<int>_> *)&local_e0,(IO *)is,
               (istream *)(ulong)*(uint *)(*(long *)this + 0x228),iVar2);
    ::std::vector<int,_std::allocator<int>_>::_M_move_assign
              ((vector<int,_std::allocator<int>_> *)(*(long *)this + 0x248),&local_e0);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_e0);
  }
  else {
    _Var4 = ::std::
            __max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (*(undefined8 *)(*(long *)this + 0x1e0),*(undefined8 *)(*(long *)this + 0x1e8)
                      );
    max_level = *_Var4._M_current;
  }
  lVar5 = *(long *)this;
  OneDimensionalWrapper::OneDimensionalWrapper
            (&local_e0,(CustomTabulated *)(lVar5 + 0x260),max_level,*(TypeOneDRule *)(lVar5 + 0x90),
             *(double *)(lVar5 + 0x98),*(double *)(lVar5 + 0xa0));
  OneDimensionalWrapper::operator=((OneDimensionalWrapper *)(*(long *)this + 0xa8),&local_e0);
  OneDimensionalWrapper::~OneDimensionalWrapper(&local_e0);
  this_00 = *(GridGlobal **)this;
  work = &(this_00->super_BaseCanonicalGrid).points;
  if ((this_00->super_BaseCanonicalGrid).points.indexes.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start ==
      (this_00->super_BaseCanonicalGrid).points.indexes.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish) {
    work = &(this_00->super_BaseCanonicalGrid).needed;
  }
  GridGlobal::recomputeTensorRefs(this_00,work);
  return (__uniq_ptr_data<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>,_true,_true>
         )(__uniq_ptr_data<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>,_true,_true>
           )this;
}

Assistant:

static std::unique_ptr<GridGlobal> read(AccelerationContext const *acc, std::istream &is){
        std::unique_ptr<GridGlobal> grid = Utils::make_unique<GridGlobal>(acc);

        grid->num_dimensions = IO::readNumber<iomode, int>(is);
        grid->num_outputs = IO::readNumber<iomode, int>(is);
        grid->alpha = IO::readNumber<iomode, double>(is);
        grid->beta = IO::readNumber<iomode, double>(is);
        grid->rule = IO::readRule<iomode>(is);
        if (grid->rule == rule_customtabulated) grid->custom = CustomTabulated(is, iomode());
        grid->tensors = MultiIndexSet(is, iomode());
        grid->active_tensors = MultiIndexSet(is, iomode());
        grid->active_w = IO::readVector<iomode, int>(is, grid->active_tensors.getNumIndexes());

        if (IO::readFlag<iomode>(is)) grid->points = MultiIndexSet(is, iomode());
        if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());

        grid->max_levels = IO::readVector<iomode, int>(is, grid->num_dimensions);

        if (grid->num_outputs > 0) grid->values = StorageSet(is, iomode());

        int oned_max_level;
        if (IO::readFlag<iomode>(is)){
            grid->updated_tensors = MultiIndexSet(is, iomode());
            oned_max_level = grid->updated_tensors.getMaxIndex();

            grid->updated_active_tensors = MultiIndexSet(is, iomode());

            grid->updated_active_w = IO::readVector<iomode, int>(is, grid->updated_active_tensors.getNumIndexes());
        }else{
            oned_max_level = *std::max_element(grid->max_levels.begin(), grid->max_levels.end());
        }

        grid->wrapper = OneDimensionalWrapper(grid->custom, oned_max_level, grid->rule, grid->alpha, grid->beta);

        grid->recomputeTensorRefs((grid->points.empty()) ? grid->needed : grid->points);

        return grid;
    }